

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O1

void __thiscall
TPZDohrAssembly<std::complex<double>_>::Read
          (TPZDohrAssembly<std::complex<double>_> *this,TPZStream *buf,void *context)

{
  undefined8 in_RAX;
  long lVar1;
  long lVar2;
  int ncoarse;
  int nfine;
  undefined8 local_28;
  
  local_28 = in_RAX;
  (*buf->_vptr_TPZStream[0x1d])(buf,(long)&local_28 + 4,1);
  (*(this->fFineEqs)._vptr_TPZVec[3])(&this->fFineEqs,(long)local_28._4_4_);
  if (0 < local_28._4_4_) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      TPZStream::Read<int>
                (buf,(TPZVec<int> *)((long)&((this->fFineEqs).fStore)->_vptr_TPZVec + lVar2),
                 (void *)0x0);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar1 < local_28._4_4_);
  }
  (*buf->_vptr_TPZStream[0x1d])(buf,&local_28,1);
  (*(this->fCoarseEqs)._vptr_TPZVec[3])(&this->fCoarseEqs,(long)(int)local_28);
  if (0 < (int)local_28) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      TPZStream::Read<int>
                (buf,(TPZVec<int> *)((long)&((this->fCoarseEqs).fStore)->_vptr_TPZVec + lVar2),
                 (void *)0x0);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar1 < (int)local_28);
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Read(TPZStream &buf, void *context)
{
    int nfine;
    buf.Read(&nfine);
    fFineEqs.resize(nfine);
    for (int f=0; f<nfine; f++) {
        buf.Read( fFineEqs[f]);
    }
    int ncoarse;
    buf.Read(&ncoarse);
    fCoarseEqs.resize(ncoarse);
    for (int nc=0; nc<ncoarse; nc++) {
        buf.Read( fCoarseEqs[nc]);
    }    
}